

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int renameParseSql(Parse *p,char *zDb,int bTable,sqlite3 *db,char *zSql,int bTemp)

{
  u8 uVar1;
  int iVar2;
  int iVar3;
  char *zErr;
  char *local_30;
  
  local_30 = (char *)0x0;
  uVar1 = '\x01';
  if (bTemp == 0) {
    iVar2 = sqlite3FindDbName(db,zDb);
    uVar1 = (u8)iVar2;
  }
  (db->init).iDb = uVar1;
  memset(&p->zErrMsg,0,400);
  p->eParseMode = bTable == 0 ^ 3;
  p->db = db;
  p->nQueryLoop = 1;
  iVar3 = sqlite3RunParser(p,zSql,&local_30);
  p->zErrMsg = local_30;
  iVar2 = 7;
  if (db->mallocFailed == '\0') {
    iVar2 = iVar3;
  }
  if (iVar2 == 0) {
    if ((p->pNewTable == (Table *)0x0) && (p->pNewIndex == (Index *)0x0)) {
      iVar2 = 0;
      if (p->pNewTrigger == (Trigger *)0x0) {
        iVar2 = 0xb;
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x19010,
                    "bf8c1b2b7a5960c282e543b9c293686dccff272512d08865f4600fb58238b4f9");
      }
    }
    else {
      iVar2 = 0;
    }
  }
  (db->init).iDb = '\0';
  return iVar2;
}

Assistant:

static int renameParseSql(
  Parse *p,                       /* Memory to use for Parse object */
  const char *zDb,                /* Name of schema SQL belongs to */
  int bTable,                     /* 1 -> RENAME TABLE, 0 -> RENAME COLUMN */
  sqlite3 *db,                    /* Database handle */
  const char *zSql,               /* SQL to parse */
  int bTemp                       /* True if SQL is from temp schema */
){
  int rc;
  char *zErr = 0;

  db->init.iDb = bTemp ? 1 : sqlite3FindDbName(db, zDb);

  /* Parse the SQL statement passed as the first argument. If no error
  ** occurs and the parse does not result in a new table, index or
  ** trigger object, the database must be corrupt. */
  memset(p, 0, sizeof(Parse));
  p->eParseMode = (bTable ? PARSE_MODE_RENAME_TABLE : PARSE_MODE_RENAME_COLUMN);
  p->db = db;
  p->nQueryLoop = 1;
  rc = sqlite3RunParser(p, zSql, &zErr);
  assert( p->zErrMsg==0 );
  assert( rc!=SQLITE_OK || zErr==0 );
  assert( (0!=p->pNewTable) + (0!=p->pNewIndex) + (0!=p->pNewTrigger)<2 );
  p->zErrMsg = zErr;
  if( db->mallocFailed ) rc = SQLITE_NOMEM;
  if( rc==SQLITE_OK 
   && p->pNewTable==0 && p->pNewIndex==0 && p->pNewTrigger==0 
  ){
    rc = SQLITE_CORRUPT_BKPT;
  }

#ifdef SQLITE_DEBUG
  /* Ensure that all mappings in the Parse.pRename list really do map to
  ** a part of the input string.  */
  if( rc==SQLITE_OK ){
    int nSql = sqlite3Strlen30(zSql);
    RenameToken *pToken;
    for(pToken=p->pRename; pToken; pToken=pToken->pNext){
      assert( pToken->t.z>=zSql && &pToken->t.z[pToken->t.n]<=&zSql[nSql] );
    }
  }
#endif

  db->init.iDb = 0;
  return rc;
}